

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

ssize_t __thiscall Parsing::File::write(File *this,int __fd,void *__buf,size_t __n)

{
  undefined8 *puVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 unaff_RBX;
  undefined4 in_register_00000034;
  string *s;
  undefined8 *puVar4;
  bool bVar5;
  ofstream f;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  iVar2 = access((this->_path)._M_dataplus._M_p,0);
  bVar5 = (this->_path)._M_string_length != 0;
  if (bVar5 && iVar2 != -1) {
    std::ofstream::ofstream((ofstream *)&local_228,(string *)&this->_path,_S_out);
    puVar1 = (undefined8 *)((undefined8 *)CONCAT44(in_register_00000034,__fd))[1];
    for (puVar4 = *(undefined8 **)CONCAT44(in_register_00000034,__fd); puVar4 != puVar1;
        puVar4 = puVar4 + 4) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_228,(char *)*puVar4,puVar4[1]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    std::ofstream::close();
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(local_130);
  }
  return CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar5 && iVar2 != -1) & 0xffffffff;
}

Assistant:

bool File::write(const std::vector<std::string> &in) const noexcept
    {
        if (!isFile() || _path.empty())
            return false;

        std::ofstream f(_path);

        for (const std::string &s : in)
            f << s << std::endl;
        f.close();

        return true;
    }